

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void CopyBlock32b(uint32_t *dst,int dist,int length)

{
  uint64_t *src_00;
  int in_EDX;
  int in_ESI;
  uint32_t *in_RDI;
  int i;
  uint64_t pattern;
  uint32_t *src;
  int local_24;
  uint64_t local_20;
  
  src_00 = (uint64_t *)(in_RDI + -(long)in_ESI);
  if (((in_ESI < 3) && (3 < in_EDX)) && (((ulong)in_RDI & 3) == 0)) {
    if (in_ESI == 1) {
      local_20 = CONCAT44((uint32_t)*src_00,(uint32_t)*src_00);
    }
    else {
      local_20 = *src_00;
    }
    CopySmallPattern32b((uint32_t *)src_00,in_RDI,in_EDX,local_20);
  }
  else if (in_ESI < in_EDX) {
    for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
      in_RDI[local_24] = *(uint32_t *)((long)src_00 + (long)local_24 * 4);
    }
  }
  else {
    memcpy(in_RDI,src_00,(long)in_EDX << 2);
  }
  return;
}

Assistant:

static WEBP_INLINE void CopyBlock32b(uint32_t* const dst,
                                     int dist, int length) {
  const uint32_t* const src = dst - dist;
  if (dist <= 2 && length >= 4 && ((uintptr_t)dst & 3) == 0) {
    uint64_t pattern;
    if (dist == 1) {
      pattern = (uint64_t)src[0];
      pattern |= pattern << 32;
    } else {
      memcpy(&pattern, src, sizeof(pattern));
    }
    CopySmallPattern32b(src, dst, length, pattern);
  } else if (dist >= length) {  // no overlap
    memcpy(dst, src, length * sizeof(*dst));
  } else {
    int i;
    for (i = 0; i < length; ++i) dst[i] = src[i];
  }
}